

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O3

tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* eval_args_abi_cxx11_
            (tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ImageSize IVar7;
  runtime_error *prVar8;
  int num_threads;
  string filename;
  string colors;
  int local_90;
  int local_8c;
  double local_88;
  double local_80;
  double local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc - 0xcU < 0xfffffffe) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"invalid number of arguments");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_8c = eval_arg<int>(argv[1],1,100000);
  iVar1 = eval_arg<int>(argv[2],1,100000);
  iVar2 = eval_arg<int>(argv[3],1,1000000000);
  iVar3 = eval_arg<int>(argv[4],1,1000000);
  local_78 = eval_arg<double>(argv[5],-100.0,100.0);
  local_80 = eval_arg<double>(argv[6],-100.0,100.0);
  local_88 = eval_arg<double>(argv[7],-100.0,100.0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,argv[8],(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,argv[9],(allocator<char> *)&local_90);
  if (argc == 0xb) {
    iVar4 = eval_arg<int>(argv[10],2,1000);
  }
  else {
    iVar5 = std::thread::hardware_concurrency();
    iVar4 = 6;
    if (6 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + -2;
  }
  local_90 = iVar4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"using ",6);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," threads\n",9);
  if (iVar4 <= iVar1) {
    std::_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string,int>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,int&,void>
              ((_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string,int> *)
               __return_storage_ptr__,&local_50,&local_70,&local_90);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .
    super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .
    super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<3UL,_int,_false>._M_head_impl = iVar3;
    *(int *)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             ).
             super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .field_0x4c = iVar2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_x = local_78;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_y = local_80;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.height = local_88;
    IVar7.height = iVar1;
    IVar7.width = local_8c;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).super__Head_base<0UL,_ImageSize,_false>._M_head_impl = IVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar8,
             "maximum number of threads must not exceed the number of pixel rows of the image");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto eval_args(const int argc, char const* argv[])
{
    if (argc < 10 || argc > 11)
        throw std::runtime_error("invalid number of arguments");

    auto image_width    = eval_arg(argv[1], 1, 100000);
    auto image_height   = eval_arg(argv[2], 1, 100000);
    auto max_iterations = eval_arg(argv[3], 1, 1000000000);
    auto repetitions    = eval_arg(argv[4], 1, 1000000);
    auto center_x       = eval_arg(argv[5], -100.0, 100.0);
    auto center_y       = eval_arg(argv[6], -100.0, 100.0);
    auto height         = eval_arg(argv[7], -100.0, 100.0);
    auto colors         = std::string{argv[8]};
    auto filename       = std::string{argv[9]};
    auto num_threads    = (argc == 11) ? eval_arg(argv[10], 2, 1000) : std::max(static_cast<int>(std::thread::hardware_concurrency()) - 2, 4);

    std::cout << "using " << num_threads << " threads\n";

    if (num_threads > image_height)
        throw std::runtime_error("maximum number of threads must not exceed the number of pixel rows of the image");

    return std::make_tuple(ImageSize{image_width, image_height}, Section{center_x, center_y, height}, max_iterations, repetitions, colors, filename, num_threads);
}